

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

void __thiscall
t_c_glib_generator::generate_service_handler(t_c_glib_generator *this,t_service *tservice)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  t_service *ptVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  t_type *ptVar6;
  t_struct *ptVar7;
  t_struct *ptVar8;
  members_type *pmVar9;
  members_type *this_00;
  reference pptVar10;
  size_type sVar11;
  reference pptVar12;
  string *psVar13;
  string local_c38;
  string local_c18;
  string local_bf8;
  undefined1 local_bd8 [8];
  string method_name_4;
  string function_name_1;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_b90;
  undefined8 local_b88;
  string local_b80;
  string local_b60;
  string local_b40;
  undefined1 local_b20 [8];
  string method_name_3;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_af8;
  undefined8 local_af0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_ae8
  ;
  t_field **local_ae0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_ad8
  ;
  t_field **local_ad0;
  string local_ac8;
  string local_aa8;
  string local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  undefined1 local_a28 [8];
  t_function implementing_function;
  const_iterator field_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *xceptions;
  vector<t_field_*,_std::allocator<t_field_*>_> *args;
  t_struct *x_list_2;
  t_struct *arg_list_2;
  t_type *return_type_2;
  undefined1 local_938 [8];
  string method_name_2;
  string function_name;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_8f0;
  undefined8 local_8e8;
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [39];
  byte local_889;
  string local_888;
  byte local_862;
  allocator local_861;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  byte local_839;
  string local_838;
  byte local_812;
  allocator local_811;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  byte local_7ec;
  allocator local_7eb;
  byte local_7ea;
  byte local_7e9;
  string local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  undefined1 local_6c8 [8];
  string params_1;
  bool has_xceptions_1;
  bool has_args_1;
  bool has_return_1;
  t_struct *x_list_1;
  t_struct *arg_list_1;
  t_type *return_type_1;
  undefined1 local_668 [8];
  string method_name_1;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_640;
  undefined8 local_638;
  byte local_629;
  string local_628;
  byte local_602;
  allocator local_601;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  byte local_5d9;
  string local_5d8;
  byte local_5b2;
  allocator local_5b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  byte local_58c;
  allocator local_58b;
  byte local_58a;
  byte local_589;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  undefined1 local_468 [8];
  string params;
  bool has_xceptions;
  bool has_args;
  bool has_return;
  t_struct *x_list;
  t_struct *arg_list;
  t_type *return_type;
  undefined1 local_408 [8];
  string method_name;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_3e0;
  undefined8 local_3d8;
  string local_3d0;
  string local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  undefined1 local_2d0 [8];
  string parent_service_name_uc;
  string local_290;
  undefined1 local_270 [8];
  string parent_service_name_lc;
  string parent_service_name;
  t_service *extends_service;
  string args_indent;
  string parent_type_name;
  string parent_class_name;
  undefined1 local_1a8 [8];
  string class_name_uc;
  string local_168;
  undefined1 local_148 [8];
  string class_name_lc;
  string class_name;
  string service_handler_name;
  undefined1 local_c8 [8];
  string service_name_uc;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  string service_name_lc;
  const_iterator function_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  t_service *tservice_local;
  t_c_glib_generator *this_local;
  
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  ::__normal_iterator((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                       *)((long)&service_name_lc.field_2 + 8));
  std::__cxx11::string::string
            ((string *)&local_98,
             (string *)&(this->super_t_oop_generator).super_t_generator.service_name_);
  initial_caps_to_underscores(&local_78,&local_98);
  to_lower_case((string *)local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string
            ((string *)(service_handler_name.field_2._M_local_buf + 8),(string *)local_58);
  to_upper_case((string *)local_c8,(string *)((long)&service_handler_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(service_handler_name.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&class_name.field_2 + 8),
                 &(this->super_t_oop_generator).super_t_generator.service_name_,"Handler");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&class_name_lc.field_2 + 8),&this->nspace,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&class_name.field_2 + 8));
  std::__cxx11::string::string
            ((string *)(class_name_uc.field_2._M_local_buf + 8),
             (string *)(class_name.field_2._M_local_buf + 8));
  initial_caps_to_underscores(&local_168,(string *)((long)&class_name_uc.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 &this->nspace_lc,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)(class_name_uc.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)(parent_class_name.field_2._M_local_buf + 8),(string *)local_148);
  to_upper_case((string *)local_1a8,(string *)((long)&parent_class_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(parent_class_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(parent_type_name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(args_indent.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&extends_service);
  ptVar4 = t_service::get_extends(tservice);
  if (ptVar4 == (t_service *)0x0) {
    std::__cxx11::string::operator=((string *)(parent_type_name.field_2._M_local_buf + 8),"GObject")
    ;
    std::__cxx11::string::operator=
              ((string *)(args_indent.field_2._M_local_buf + 8),"G_TYPE_OBJECT");
  }
  else {
    iVar2 = (*(ptVar4->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::__cxx11::string::string
              ((string *)(parent_service_name_lc.field_2._M_local_buf + 8),
               (string *)CONCAT44(extraout_var,iVar2));
    std::__cxx11::string::string
              ((string *)(parent_service_name_uc.field_2._M_local_buf + 8),
               (string *)(parent_service_name_lc.field_2._M_local_buf + 8));
    initial_caps_to_underscores(&local_290,(string *)((long)&parent_service_name_uc.field_2 + 8));
    to_lower_case((string *)local_270,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)(parent_service_name_uc.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_2f0,(string *)local_270);
    to_upper_case((string *)local_2d0,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::operator+(&local_330,&this->nspace,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&parent_service_name_lc.field_2 + 8));
    std::operator+(&local_310,&local_330,"Handler");
    std::__cxx11::string::operator=
              ((string *)(parent_type_name.field_2._M_local_buf + 8),(string *)&local_310);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::operator+(&local_390,&this->nspace_uc,"TYPE_");
    std::operator+(&local_370,&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    std::operator+(&local_350,&local_370,"_HANDLER");
    std::__cxx11::string::operator=
              ((string *)(args_indent.field_2._M_local_buf + 8),(string *)&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)local_270);
    std::__cxx11::string::~string((string *)(parent_service_name_lc.field_2._M_local_buf + 8));
  }
  poVar5 = std::operator<<((ostream *)&this->f_header_,"/* ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar5 = std::operator<<(poVar5," handler (abstract base class) */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"struct _");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&this->f_header_,(string *)&local_3b0);
  poVar5 = std::operator<<(poVar5,(string *)(parent_type_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," parent;");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3b0);
  t_generator::indent_down((t_generator *)this);
  poVar5 = std::operator<<((ostream *)&this->f_header_,"};");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"typedef struct _");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,";");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_header_,"struct _");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&this->f_header_,(string *)&local_3d0);
  poVar5 = std::operator<<(poVar5,(string *)(parent_type_name.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class parent;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3d0);
  local_3e0._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_3d8,&local_3e0);
  service_name_lc.field_2._8_8_ = local_3d8;
  while( true ) {
    method_name.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&service_name_lc.field_2 + 8),
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&method_name.field_2 + 8));
    if (!bVar1) break;
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    psVar13 = t_function::get_name_abi_cxx11_(*pptVar12);
    std::__cxx11::string::string((string *)&return_type,(string *)psVar13);
    initial_caps_to_underscores((string *)local_408,(string *)&return_type);
    std::__cxx11::string::~string((string *)&return_type);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar6 = t_function::get_returntype(*pptVar12);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar7 = t_function::get_arglist(*pptVar12);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar8 = t_function::get_xceptions(*pptVar12);
    iVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[4])();
    params.field_2._M_local_buf[0xf] = ~(byte)iVar2 & 1;
    pmVar9 = t_struct::get_members(ptVar7);
    sVar11 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmVar9);
    params.field_2._M_local_buf[0xe] = sVar11 == 0;
    pmVar9 = t_struct::get_members(ptVar8);
    sVar11 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmVar9);
    params.field_2._M_local_buf[0xd] = sVar11 == 0;
    std::operator+(&local_528,"(",&this->nspace);
    std::operator+(&local_508,&local_528,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+(&local_4e8,&local_508,"If *iface");
    local_589 = 0;
    local_58a = 0;
    local_58c = 0;
    if ((params.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      local_58c = 1;
      std::__cxx11::string::string((string *)&local_548,"",&local_58b);
    }
    else {
      type_name_abi_cxx11_(&local_588,this,ptVar6,false,false);
      local_589 = 1;
      std::operator+(&local_568,", ",&local_588);
      local_58a = 1;
      std::operator+(&local_548,&local_568,"* _return");
    }
    std::operator+(&local_4c8,&local_4e8,&local_548);
    local_5b2 = 0;
    local_5d9 = 0;
    if ((params.field_2._M_local_buf[0xe] & 1U) == 0) {
      argument_list_abi_cxx11_(&local_5d8,this,ptVar7);
      local_5d9 = 1;
      std::operator+(&local_5b0,", ",&local_5d8);
    }
    else {
      std::allocator<char>::allocator();
      local_5b2 = 1;
      std::__cxx11::string::string((string *)&local_5b0,"",&local_5b1);
    }
    std::operator+(&local_4a8,&local_4c8,&local_5b0);
    local_602 = 0;
    local_629 = 0;
    if ((params.field_2._M_local_buf[0xd] & 1U) == 0) {
      xception_list_abi_cxx11_(&local_628,this,ptVar8);
      local_629 = 1;
      std::operator+(&local_600,", ",&local_628);
    }
    else {
      std::allocator<char>::allocator();
      local_602 = 1;
      std::__cxx11::string::string((string *)&local_600,"",&local_601);
    }
    std::operator+(&local_488,&local_4a8,&local_600);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_468,
                   &local_488,", GError **error)");
    std::__cxx11::string::~string((string *)&local_488);
    std::__cxx11::string::~string((string *)&local_600);
    if ((local_629 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_628);
    }
    if ((local_602 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_601);
    }
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_5b0);
    if ((local_5d9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_5d8);
    }
    if ((local_5b2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
    }
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_548);
    if ((local_58c & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_58b);
    }
    if ((local_58a & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_568);
    }
    if ((local_589 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_588);
    }
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
    poVar5 = std::operator<<(poVar5,"gboolean (*");
    poVar5 = std::operator<<(poVar5,(string *)local_408);
    poVar5 = std::operator<<(poVar5,") ");
    poVar5 = std::operator<<(poVar5,(string *)local_468);
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_468);
    std::__cxx11::string::~string((string *)local_408);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  *)((long)&service_name_lc.field_2 + 8));
  }
  t_generator::indent_down((t_generator *)this);
  poVar5 = std::operator<<((ostream *)&this->f_header_,"};");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"typedef struct _");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class ");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class;");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_header_,"GType ");
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_get_type (void);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER ");
  poVar5 = std::operator<<(poVar5,"(");
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_get_type())");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)local_1a8);
  poVar5 = std::operator<<(poVar5,"(obj) ");
  poVar5 = std::operator<<(poVar5,"(G_TYPE_CHECK_INSTANCE_CAST ((obj), ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER, ");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"))");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"IS_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER(obj) ");
  poVar5 = std::operator<<(poVar5,"(G_TYPE_CHECK_INSTANCE_TYPE ((obj), ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER))");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)local_1a8);
  poVar5 = std::operator<<(poVar5,"_CLASS(c) (G_TYPE_CHECK_CLASS_CAST ((c), ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER, ");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class))");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"IS_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER_CLASS(c) ");
  poVar5 = std::operator<<(poVar5,"(G_TYPE_CHECK_CLASS_TYPE ((c), ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER))");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER_GET_CLASS(obj) ");
  poVar5 = std::operator<<(poVar5,"(G_TYPE_INSTANCE_GET_CLASS ((obj), ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_HANDLER, ");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class))");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  local_640._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_638,&local_640);
  service_name_lc.field_2._8_8_ = local_638;
  while( true ) {
    method_name_1.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&service_name_lc.field_2 + 8),
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&method_name_1.field_2 + 8));
    if (!bVar1) break;
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    psVar13 = t_function::get_name_abi_cxx11_(*pptVar12);
    std::__cxx11::string::string((string *)&return_type_1,(string *)psVar13);
    initial_caps_to_underscores((string *)local_668,(string *)&return_type_1);
    std::__cxx11::string::~string((string *)&return_type_1);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar6 = t_function::get_returntype(*pptVar12);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar7 = t_function::get_arglist(*pptVar12);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar8 = t_function::get_xceptions(*pptVar12);
    iVar2 = (*(ptVar6->super_t_doc)._vptr_t_doc[4])();
    params_1.field_2._M_local_buf[0xf] = ~(byte)iVar2 & 1;
    pmVar9 = t_struct::get_members(ptVar7);
    sVar11 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmVar9);
    params_1.field_2._M_local_buf[0xe] = sVar11 == 0;
    pmVar9 = t_struct::get_members(ptVar8);
    sVar11 = std::vector<t_field_*,_std::allocator<t_field_*>_>::size(pmVar9);
    params_1.field_2._M_local_buf[0xd] = sVar11 == 0;
    std::operator+(&local_788,"(",&this->nspace);
    std::operator+(&local_768,&local_788,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+(&local_748,&local_768,"If *iface");
    local_7e9 = 0;
    local_7ea = 0;
    local_7ec = 0;
    if ((params_1.field_2._M_local_buf[0xf] & 1U) == 0) {
      std::allocator<char>::allocator();
      local_7ec = 1;
      std::__cxx11::string::string((string *)&local_7a8,"",&local_7eb);
    }
    else {
      type_name_abi_cxx11_(&local_7e8,this,ptVar6,false,false);
      local_7e9 = 1;
      std::operator+(&local_7c8,", ",&local_7e8);
      local_7ea = 1;
      std::operator+(&local_7a8,&local_7c8,"* _return");
    }
    std::operator+(&local_728,&local_748,&local_7a8);
    local_812 = 0;
    local_839 = 0;
    if ((params_1.field_2._M_local_buf[0xe] & 1U) == 0) {
      argument_list_abi_cxx11_(&local_838,this,ptVar7);
      local_839 = 1;
      std::operator+(&local_810,", ",&local_838);
    }
    else {
      std::allocator<char>::allocator();
      local_812 = 1;
      std::__cxx11::string::string((string *)&local_810,"",&local_811);
    }
    std::operator+(&local_708,&local_728,&local_810);
    local_862 = 0;
    local_889 = 0;
    if ((params_1.field_2._M_local_buf[0xd] & 1U) == 0) {
      xception_list_abi_cxx11_(&local_888,this,ptVar8);
      local_889 = 1;
      std::operator+(&local_860,", ",&local_888);
    }
    else {
      std::allocator<char>::allocator();
      local_862 = 1;
      std::__cxx11::string::string((string *)&local_860,"",&local_861);
    }
    std::operator+(&local_6e8,&local_708,&local_860);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8,
                   &local_6e8,", GError **error)");
    std::__cxx11::string::~string((string *)&local_6e8);
    std::__cxx11::string::~string((string *)&local_860);
    if ((local_889 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_888);
    }
    if ((local_862 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_861);
    }
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&local_810);
    if ((local_839 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_838);
    }
    if ((local_812 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_811);
    }
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_7a8);
    if ((local_7ec & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_7eb);
    }
    if ((local_7ea & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_7c8);
    }
    if ((local_7e9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_7e8);
    }
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&local_788);
    poVar5 = std::operator<<((ostream *)&this->f_header_,"gboolean ");
    poVar5 = std::operator<<(poVar5,(string *)local_148);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = std::operator<<(poVar5,(string *)local_668);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(string *)local_6c8);
    poVar5 = std::operator<<(poVar5,";");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_6c8);
    std::__cxx11::string::~string((string *)local_668);
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  *)((long)&service_name_lc.field_2 + 8));
  }
  std::operator<<((ostream *)&this->f_header_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_service_,"static void");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,(string *)local_58);
  poVar5 = std::operator<<(poVar5,"_if_interface_init (");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar5 = std::operator<<(poVar5,"IfInterface *iface);");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,0x19,' ',&local_8b1);
  std::__cxx11::string::operator=((string *)&extends_service,local_8b0);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  poVar5 = std::operator<<((ostream *)&this->f_service_,"G_DEFINE_TYPE_WITH_CODE (");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&extends_service);
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,",");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&extends_service);
  poVar5 = std::operator<<(poVar5,(string *)(args_indent.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,",");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)&extends_service);
  poVar5 = std::operator<<(poVar5,"G_IMPLEMENT_INTERFACE (");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,"TYPE_");
  poVar5 = std::operator<<(poVar5,(string *)local_c8);
  poVar5 = std::operator<<(poVar5,"_IF,");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,0x17,' ',&local_8d9);
  std::__cxx11::string::operator+=((string *)&extends_service,local_8d8);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&extends_service);
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,(string *)local_58);
  poVar5 = std::operator<<(poVar5,"_if_interface_init))");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  local_8f0._M_current =
       (t_function **)
       std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                 ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  __gnu_cxx::
  __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
  __normal_iterator<t_function**>
            ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
              *)&local_8e8,&local_8f0);
  service_name_lc.field_2._8_8_ = local_8e8;
  while( true ) {
    function_name.field_2._8_8_ =
         std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&service_name_lc.field_2 + 8),
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)((long)&function_name.field_2 + 8));
    if (!bVar1) break;
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    psVar13 = t_function::get_name_abi_cxx11_(*pptVar12);
    std::__cxx11::string::string
              ((string *)(method_name_2.field_2._M_local_buf + 8),(string *)psVar13);
    std::__cxx11::string::string
              ((string *)&return_type_2,(string *)(method_name_2.field_2._M_local_buf + 8));
    initial_caps_to_underscores((string *)local_938,(string *)&return_type_2);
    std::__cxx11::string::~string((string *)&return_type_2);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar6 = t_function::get_returntype(*pptVar12);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar7 = t_function::get_arglist(*pptVar12);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    ptVar8 = t_function::get_xceptions(*pptVar12);
    pmVar9 = t_struct::get_members(ptVar7);
    this_00 = t_struct::get_members(ptVar8);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       *)&implementing_function.own_xceptions_);
    std::operator+(&local_a68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   "_handler_");
    std::operator+(&local_a48,&local_a68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_938);
    pptVar12 = __gnu_cxx::
               __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                            *)((long)&service_name_lc.field_2 + 8));
    bVar1 = t_function::is_oneway(*pptVar12);
    t_function::t_function((t_function *)local_a28,ptVar6,&local_a48,ptVar7,ptVar8,bVar1);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a68);
    poVar5 = t_generator::indent((t_generator *)this,(ostream *)&this->f_service_);
    function_signature_abi_cxx11_(&local_a88,this,(t_function *)local_a28);
    poVar5 = std::operator<<(poVar5,(string *)&local_a88);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a88);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    t_generator::indent_abi_cxx11_(&local_aa8,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_aa8);
    poVar5 = std::operator<<(poVar5,"g_return_val_if_fail (");
    poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
    poVar5 = std::operator<<(poVar5,"IS_");
    poVar5 = std::operator<<(poVar5,(string *)local_c8);
    poVar5 = std::operator<<(poVar5,"_HANDLER (iface), FALSE);");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_ac8,(t_generator *)this);
    poVar5 = std::operator<<(poVar5,(string *)&local_ac8);
    poVar5 = std::operator<<(poVar5,"return ");
    poVar5 = std::operator<<(poVar5,(string *)local_1a8);
    poVar5 = std::operator<<(poVar5,"_GET_CLASS (iface)");
    poVar5 = std::operator<<(poVar5,"->");
    poVar5 = std::operator<<(poVar5,(string *)local_938);
    std::operator<<(poVar5," (iface, ");
    std::__cxx11::string::~string((string *)&local_ac8);
    std::__cxx11::string::~string((string *)&local_aa8);
    uVar3 = (*(ptVar6->super_t_doc)._vptr_t_doc[4])();
    if ((uVar3 & 1) == 0) {
      std::operator<<((ostream *)&this->f_service_,"_return, ");
    }
    local_ad0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(pmVar9);
    implementing_function._152_8_ = local_ad0;
    while( true ) {
      local_ad8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(pmVar9);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&implementing_function.own_xceptions_,&local_ad8);
      if (!bVar1) break;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&implementing_function.own_xceptions_);
      psVar13 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)psVar13);
      std::operator<<(poVar5,", ");
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&implementing_function.own_xceptions_);
    }
    local_ae0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
    implementing_function._152_8_ = local_ae0;
    while( true ) {
      local_ae8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&implementing_function.own_xceptions_,&local_ae8);
      if (!bVar1) break;
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                              *)&implementing_function.own_xceptions_);
      psVar13 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)psVar13);
      std::operator<<(poVar5,", ");
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&implementing_function.own_xceptions_);
    }
    poVar5 = std::operator<<((ostream *)&this->f_service_,"error);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
    std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
    t_function::~t_function((t_function *)local_a28);
    std::__cxx11::string::~string((string *)local_938);
    std::__cxx11::string::~string((string *)(method_name_2.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
    ::operator++((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                  *)((long)&service_name_lc.field_2 + 8));
  }
  poVar5 = std::operator<<((ostream *)&this->f_service_,"static void");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,(string *)local_58);
  poVar5 = std::operator<<(poVar5,"_if_interface_init (");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace);
  poVar5 = std::operator<<(poVar5,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar5 = std::operator<<(poVar5,"IfInterface *iface)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  sVar11 = std::vector<t_function_*,_std::allocator<t_function_*>_>::size
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  if (sVar11 == 0) {
    poVar5 = std::operator<<((ostream *)&this->f_service_,"THRIFT_UNUSED_VAR (iface);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  else {
    local_af8._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
    __gnu_cxx::
    __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
    __normal_iterator<t_function**>
              ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
                *)&local_af0,&local_af8);
    service_name_lc.field_2._8_8_ = local_af0;
    while( true ) {
      method_name_3.field_2._8_8_ =
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&service_name_lc.field_2 + 8),
                         (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&method_name_3.field_2 + 8));
      if (!bVar1) break;
      pptVar12 = __gnu_cxx::
                 __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                              *)((long)&service_name_lc.field_2 + 8));
      psVar13 = t_function::get_name_abi_cxx11_(*pptVar12);
      std::__cxx11::string::string((string *)&local_b40,(string *)psVar13);
      initial_caps_to_underscores((string *)local_b20,&local_b40);
      std::__cxx11::string::~string((string *)&local_b40);
      t_generator::indent_abi_cxx11_(&local_b60,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b60);
      poVar5 = std::operator<<(poVar5,"iface->");
      poVar5 = std::operator<<(poVar5,(string *)local_b20);
      poVar5 = std::operator<<(poVar5," = ");
      poVar5 = std::operator<<(poVar5,(string *)local_148);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = std::operator<<(poVar5,(string *)local_b20);
      poVar5 = std::operator<<(poVar5,";");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_b60);
      std::__cxx11::string::~string((string *)local_b20);
      __gnu_cxx::
      __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
      ::operator++((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                    *)((long)&service_name_lc.field_2 + 8));
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_service_,"static void");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_init (");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5," *self)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  t_generator::indent_abi_cxx11_(&local_b80,(t_generator *)this);
  poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_b80);
  poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (self);");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b80);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)&this->f_service_,"static void");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,(string *)local_148);
  poVar5 = std::operator<<(poVar5,"_class_init (");
  poVar5 = std::operator<<(poVar5,(string *)(class_name_lc.field_2._M_local_buf + 8));
  poVar5 = std::operator<<(poVar5,"Class *cls)");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  sVar11 = std::vector<t_function_*,_std::allocator<t_function_*>_>::size
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  if (sVar11 == 0) {
    t_generator::indent_abi_cxx11_(&local_c38,(t_generator *)this);
    poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c38);
    poVar5 = std::operator<<(poVar5,"THRIFT_UNUSED_VAR (cls);");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_c38);
  }
  else {
    local_b90._M_current =
         (t_function **)
         std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                   ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
    __gnu_cxx::
    __normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>::
    __normal_iterator<t_function**>
              ((__normal_iterator<t_function*const*,std::vector<t_function*,std::allocator<t_function*>>>
                *)&local_b88,&local_b90);
    service_name_lc.field_2._8_8_ = local_b88;
    while( true ) {
      function_name_1.field_2._8_8_ =
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&service_name_lc.field_2 + 8),
                         (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                          *)((long)&function_name_1.field_2 + 8));
      if (!bVar1) break;
      pptVar12 = __gnu_cxx::
                 __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                 ::operator*((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                              *)((long)&service_name_lc.field_2 + 8));
      psVar13 = t_function::get_name_abi_cxx11_(*pptVar12);
      std::__cxx11::string::string
                ((string *)(method_name_4.field_2._M_local_buf + 8),(string *)psVar13);
      std::__cxx11::string::string
                ((string *)&local_bf8,(string *)(method_name_4.field_2._M_local_buf + 8));
      initial_caps_to_underscores((string *)local_bd8,&local_bf8);
      std::__cxx11::string::~string((string *)&local_bf8);
      t_generator::indent_abi_cxx11_(&local_c18,(t_generator *)this);
      poVar5 = std::operator<<((ostream *)&this->f_service_,(string *)&local_c18);
      poVar5 = std::operator<<(poVar5,"cls->");
      poVar5 = std::operator<<(poVar5,(string *)local_bd8);
      poVar5 = std::operator<<(poVar5," = NULL;");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_c18);
      std::__cxx11::string::~string((string *)local_bd8);
      std::__cxx11::string::~string((string *)(method_name_4.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
      ::operator++((__normal_iterator<t_function_*const_*,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                    *)((long)&service_name_lc.field_2 + 8));
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)&this->f_service_);
  std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&extends_service);
  std::__cxx11::string::~string((string *)(args_indent.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(parent_type_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)local_148);
  std::__cxx11::string::~string((string *)(class_name_lc.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(class_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&function_iter);
  return;
}

Assistant:

void t_c_glib_generator::generate_service_handler(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator function_iter;

  string service_name_lc = to_lower_case(initial_caps_to_underscores(service_name_));
  string service_name_uc = to_upper_case(service_name_lc);

  string service_handler_name = service_name_ + "Handler";

  string class_name = this->nspace + service_handler_name;
  string class_name_lc = this->nspace_lc + initial_caps_to_underscores(service_handler_name);
  string class_name_uc = to_upper_case(class_name_lc);

  string parent_class_name;
  string parent_type_name;

  string args_indent;

  // The service this service extends, or nullptr if it extends no service
  t_service* extends_service = tservice->get_extends();

  // Determine the name of our parent service (if any) and the handler class'
  // parent class name and type
  if (extends_service) {
    string parent_service_name = extends_service->get_name();
    string parent_service_name_lc = to_lower_case(initial_caps_to_underscores(parent_service_name));
    string parent_service_name_uc = to_upper_case(parent_service_name_lc);

    parent_class_name = this->nspace + parent_service_name + "Handler";
    parent_type_name = this->nspace_uc + "TYPE_" + parent_service_name_uc + "_HANDLER";
  } else {
    parent_class_name = "GObject";
    parent_type_name = "G_TYPE_OBJECT";
  }

  // Generate the handler class' definition in the header file

  // Generate the handler instance definition
  f_header_ << "/* " << service_name_ << " handler (abstract base class) */" << endl << "struct _"
            << class_name << endl << "{" << endl;
  indent_up();
  f_header_ << indent() << parent_class_name << " parent;" << endl;
  indent_down();
  f_header_ << "};" << endl << "typedef struct _" << class_name << " " << class_name << ";" << endl
            << endl;

  // Generate the handler class definition, including its class members
  // (methods)
  f_header_ << "struct _" << class_name << "Class" << endl << "{" << endl;
  indent_up();
  f_header_ << indent() << parent_class_name << "Class parent;" << endl << endl;

  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string method_name = initial_caps_to_underscores((*function_iter)->get_name());
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();
    bool has_return = !return_type->is_void();
    bool has_args = arg_list->get_members().size() == 0;
    bool has_xceptions = x_list->get_members().size() == 0;

    string params = "(" + this->nspace + service_name_ + "If *iface"
                    + (has_return ? ", " + type_name(return_type) + "* _return" : "")
                    + (has_args ? "" : (", " + argument_list(arg_list)))
                    + (has_xceptions ? "" : (", " + xception_list(x_list))) + ", GError **error)";

    indent(f_header_) << "gboolean (*" << method_name << ") " << params << ";" << endl;
  }
  indent_down();

  f_header_ << "};" << endl << "typedef struct _" << class_name << "Class " << class_name
            << "Class;" << endl << endl;

  // Generate the remaining header boilerplate
  f_header_ << "GType " << class_name_lc << "_get_type (void);" << endl << "#define "
            << this->nspace_uc << "TYPE_" << service_name_uc << "_HANDLER "
            << "(" << class_name_lc << "_get_type())" << endl << "#define " << class_name_uc
            << "(obj) "
            << "(G_TYPE_CHECK_INSTANCE_CAST ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "))" << endl << "#define "
            << this->nspace_uc << "IS_" << service_name_uc << "_HANDLER(obj) "
            << "(G_TYPE_CHECK_INSTANCE_TYPE ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER))" << endl << "#define " << class_name_uc
            << "_CLASS(c) (G_TYPE_CHECK_CLASS_CAST ((c), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "Class))" << endl << "#define "
            << this->nspace_uc << "IS_" << service_name_uc << "_HANDLER_CLASS(c) "
            << "(G_TYPE_CHECK_CLASS_TYPE ((c), " << this->nspace_uc << "TYPE_" << service_name_uc
            << "_HANDLER))" << endl << "#define " << this->nspace_uc << service_name_uc
            << "_HANDLER_GET_CLASS(obj) "
            << "(G_TYPE_INSTANCE_GET_CLASS ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "Class))" << endl << endl;

  // Generate the handler class' method definitions
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string method_name = initial_caps_to_underscores((*function_iter)->get_name());
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();
    bool has_return = !return_type->is_void();
    bool has_args = arg_list->get_members().size() == 0;
    bool has_xceptions = x_list->get_members().size() == 0;

    string params = "(" + this->nspace + service_name_ + "If *iface"
                    + (has_return ? ", " + type_name(return_type) + "* _return" : "")
                    + (has_args ? "" : (", " + argument_list(arg_list)))
                    + (has_xceptions ? "" : (", " + xception_list(x_list))) + ", GError **error)";

    f_header_ << "gboolean " << class_name_lc << "_" << method_name << " " << params << ";" << endl;
  }
  f_header_ << endl;

  // Generate the handler's implementation in the implementation file

  // Generate the implementation boilerplate
  f_service_ << "static void" << endl << class_name_lc << "_" << service_name_lc
             << "_if_interface_init (" << this->nspace << service_name_ << "IfInterface *iface);"
             << endl << endl;

  args_indent = string(25, ' ');
  f_service_ << "G_DEFINE_TYPE_WITH_CODE (" << class_name << ", " << endl << args_indent
             << class_name_lc << "," << endl << args_indent << parent_type_name << "," << endl
             << args_indent << "G_IMPLEMENT_INTERFACE (" << this->nspace_uc << "TYPE_"
             << service_name_uc << "_IF," << endl;
  args_indent += string(23, ' ');
  f_service_ << args_indent << class_name_lc << "_" << service_name_lc << "_if_interface_init))"
             << endl << endl;

  // Generate the handler method implementations
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string function_name = (*function_iter)->get_name();
    string method_name = initial_caps_to_underscores(function_name);
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();

    const vector<t_field*>& args = arg_list->get_members();
    const vector<t_field*>& xceptions = x_list->get_members();

    vector<t_field*>::const_iterator field_iter;

    t_function implementing_function(return_type,
                                     service_name_lc + "_handler_" + method_name,
                                     arg_list,
                                     x_list,
                                     (*function_iter)->is_oneway());

    indent(f_service_) << function_signature(&implementing_function) << endl;
    scope_up(f_service_);
    f_service_ << indent() << "g_return_val_if_fail (" << this->nspace_uc << "IS_"
               << service_name_uc << "_HANDLER (iface), FALSE);" << endl << endl << indent()
               << "return " << class_name_uc << "_GET_CLASS (iface)"
               << "->" << method_name << " (iface, ";

    if (!return_type->is_void()) {
      f_service_ << "_return, ";
    }
    for (field_iter = args.begin(); field_iter != args.end(); ++field_iter) {
      f_service_ << (*field_iter)->get_name() << ", ";
    }
    for (field_iter = xceptions.begin(); field_iter != xceptions.end(); ++field_iter) {
      f_service_ << (*field_iter)->get_name() << ", ";
    }
    f_service_ << "error);" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate the handler interface initializer
  f_service_ << "static void" << endl << class_name_lc << "_" << service_name_lc
             << "_if_interface_init (" << this->nspace << service_name_ << "IfInterface *iface)"
             << endl;
  scope_up(f_service_);
  if (functions.size() > 0) {
    for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
      string method_name = initial_caps_to_underscores((*function_iter)->get_name());

      f_service_ << indent() << "iface->" << method_name << " = " << class_name_lc << "_"
                 << method_name << ";" << endl;
    }
  }
  else {
    f_service_ << "THRIFT_UNUSED_VAR (iface);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  // Generate the handler instance initializer
  f_service_ << "static void" << endl << class_name_lc << "_init (" << class_name << " *self)"
             << endl;
  scope_up(f_service_);
  f_service_ << indent() << "THRIFT_UNUSED_VAR (self);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  // Generate the handler class initializer
  f_service_ << "static void" << endl
             << class_name_lc << "_class_init (" << class_name << "Class *cls)"
             << endl;
  scope_up(f_service_);
  if (functions.size() > 0) {
    for (function_iter = functions.begin();
         function_iter != functions.end();
         ++function_iter) {
      string function_name = (*function_iter)->get_name();
      string method_name = initial_caps_to_underscores(function_name);

      // All methods are pure virtual and must be implemented by subclasses
      f_service_ << indent() << "cls->" << method_name << " = NULL;" << endl;
    }
  }
  else {
    f_service_ << indent() << "THRIFT_UNUSED_VAR (cls);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;
}